

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzfmatrix.h
# Opt level: O1

void __thiscall
TPZFNMatrix<100,_std::complex<long_double>_>::TPZFNMatrix
          (TPZFNMatrix<100,_std::complex<long_double>_> *this,int64_t row,int64_t col,
          complex<long_double> *val)

{
  complex<long_double> *pcVar1;
  complex<long_double> *pcVar2;
  long lVar3;
  ulong uVar4;
  
  (this->super_TPZFMatrix<std::complex<long_double>_>).super_TPZMatrix<std::complex<long_double>_>.
  super_TPZBaseMatrix.fRow = 0;
  (this->super_TPZFMatrix<std::complex<long_double>_>).super_TPZMatrix<std::complex<long_double>_>.
  super_TPZBaseMatrix.fCol = 0;
  (this->super_TPZFMatrix<std::complex<long_double>_>).super_TPZMatrix<std::complex<long_double>_>.
  super_TPZBaseMatrix.fRow = row;
  (this->super_TPZFMatrix<std::complex<long_double>_>).super_TPZMatrix<std::complex<long_double>_>.
  super_TPZBaseMatrix.fCol = col;
  (this->super_TPZFMatrix<std::complex<long_double>_>).super_TPZMatrix<std::complex<long_double>_>.
  super_TPZBaseMatrix.fDecomposed = '\0';
  (this->super_TPZFMatrix<std::complex<long_double>_>).super_TPZMatrix<std::complex<long_double>_>.
  super_TPZBaseMatrix.fDefPositive = '\0';
  (this->super_TPZFMatrix<std::complex<long_double>_>).super_TPZMatrix<std::complex<long_double>_>.
  super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable = (_func_int **)&PTR__TPZFMatrix_01861a60;
  (this->super_TPZFMatrix<std::complex<long_double>_>).fElem = this->fBuf;
  (this->super_TPZFMatrix<std::complex<long_double>_>).fGiven = this->fBuf;
  (this->super_TPZFMatrix<std::complex<long_double>_>).fSize = 100;
  pcVar1 = (complex<long_double> *)0x0;
  TPZVec<int>::TPZVec(&(this->super_TPZFMatrix<std::complex<long_double>_>).fPivot.super_TPZVec<int>
                      ,0);
  (this->super_TPZFMatrix<std::complex<long_double>_>).fPivot.super_TPZVec<int>._vptr_TPZVec =
       (_func_int **)&PTR__TPZManVector_0183cde8;
  (this->super_TPZFMatrix<std::complex<long_double>_>).fPivot.super_TPZVec<int>.fStore =
       (this->super_TPZFMatrix<std::complex<long_double>_>).fPivot.fExtAlloc;
  (this->super_TPZFMatrix<std::complex<long_double>_>).fPivot.super_TPZVec<int>.fNElements = 0;
  (this->super_TPZFMatrix<std::complex<long_double>_>).fPivot.super_TPZVec<int>.fNAlloc = 0;
  (this->super_TPZFMatrix<std::complex<long_double>_>).fWork._vptr_TPZVec =
       (_func_int **)&PTR__TPZVec_018462a8;
  (this->super_TPZFMatrix<std::complex<long_double>_>).fWork.fStore = (complex<long_double> *)0x0;
  (this->super_TPZFMatrix<std::complex<long_double>_>).fWork.fNElements = 0;
  (this->super_TPZFMatrix<std::complex<long_double>_>).fWork.fNAlloc = 0;
  uVar4 = col * row;
  if (uVar4 != 0) {
    if ((long)uVar4 < 0x65) goto LAB_014dab13;
    pcVar1 = (complex<long_double> *)operator_new__(-(ulong)(uVar4 >> 0x3b != 0) | uVar4 * 0x20);
    pcVar2 = pcVar1;
    do {
      *(longdouble *)pcVar2->_M_value = (longdouble)0;
      *(longdouble *)((long)pcVar2->_M_value + 0x10) = (longdouble)0;
      pcVar2 = pcVar2 + 1;
    } while (pcVar2 != pcVar1 + uVar4);
  }
  (this->super_TPZFMatrix<std::complex<long_double>_>).fElem = pcVar1;
LAB_014dab13:
  (this->super_TPZFMatrix<std::complex<long_double>_>).super_TPZMatrix<std::complex<long_double>_>.
  super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable = (_func_int **)&PTR__TPZFNMatrix_01861770;
  lVar3 = 0xa0;
  do {
    *(longdouble *)
     ((long)(this->super_TPZFMatrix<std::complex<long_double>_>).fPivot.fExtAlloc + lVar3 + -0x68) =
         (longdouble)0;
    *(longdouble *)
     ((long)(&((TPZFMatrix<std::complex<long_double>_> *)
              (&((TPZFMatrix<std::complex<long_double>_> *)
                (&(this->super_TPZFMatrix<std::complex<long_double>_>).fPivot + -1))->fPivot + -1))
              ->fPivot + 0xffffffffffffffff) + lVar3) = (longdouble)0;
    lVar3 = lVar3 + 0x20;
  } while (lVar3 != 0xd40);
  TPZFMatrix<std::complex<long_double>_>::operator=
            (&this->super_TPZFMatrix<std::complex<long_double>_>,
             *(complex<long_double> *)val->_M_value);
  return;
}

Assistant:

inline  TPZFNMatrix(int64_t row, int64_t col, const TVar &val) : TPZRegisterClassId(&TPZFNMatrix<N,TVar>::ClassId), 
    TPZFMatrix<TVar>(row,col,fBuf,N) {
        TPZFMatrix<TVar>::operator=(val);
    }